

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::AdaptEcdsaAdaptorRequest,cfd::js::api::json::SignatureDataResponse,cfd::js::api::AdaptEcdsaAdaptorRequestStruct,cfd::js::api::SignatureDataResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::SignatureDataResponseStruct_(const_cfd::js::api::AdaptEcdsaAdaptorRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  SignatureDataResponseStruct response;
  SignatureDataResponse res;
  AdaptEcdsaAdaptorRequestStruct request;
  AdaptEcdsaAdaptorRequest req;
  string local_2a8;
  SignatureDataResponseStruct local_288;
  ErrorResponse local_1c0;
  AdaptEcdsaAdaptorRequestStruct local_108;
  AdaptEcdsaAdaptorRequest local_98;
  
  AdaptEcdsaAdaptorRequest::AdaptEcdsaAdaptorRequest(&local_98);
  core::JsonClassBase<cfd::js::api::json::AdaptEcdsaAdaptorRequest>::Deserialize
            (&local_98.super_JsonClassBase<cfd::js::api::json::AdaptEcdsaAdaptorRequest>,
             (string *)this);
  AdaptEcdsaAdaptorRequest::ConvertToStruct(&local_108,&local_98);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_288,request_message,&local_108);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_288.error.code == 0) {
      SignatureDataResponse::SignatureDataResponse((SignatureDataResponse *)&local_1c0);
      SignatureDataResponse::ConvertFromStruct((SignatureDataResponse *)&local_1c0,&local_288);
      core::JsonClassBase<cfd::js::api::json::SignatureDataResponse>::Serialize_abi_cxx11_
                (&local_2a8,(JsonClassBase<cfd::js::api::json::SignatureDataResponse> *)&local_1c0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      SignatureDataResponse::~SignatureDataResponse((SignatureDataResponse *)&local_1c0);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_1c0,&local_288.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_2a8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_1c0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      local_1c0.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_1c0.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1c0.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_288.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_288.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.error.message._M_dataplus._M_p != &local_288.error.message.field_2) {
      operator_delete(local_288.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.error.type._M_dataplus._M_p != &local_288.error.type.field_2) {
      operator_delete(local_288.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.signature._M_dataplus._M_p != &local_288.signature.field_2) {
      operator_delete(local_288.signature._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_108.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.secret._M_dataplus._M_p != &local_108.secret.field_2) {
      operator_delete(local_108.secret._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.adaptor_signature._M_dataplus._M_p != &local_108.adaptor_signature.field_2) {
      operator_delete(local_108.adaptor_signature._M_dataplus._M_p);
    }
    AdaptEcdsaAdaptorRequest::~AdaptEcdsaAdaptorRequest(&local_98);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  SignatureDataResponse::~SignatureDataResponse((SignatureDataResponse *)&local_1c0);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  SignatureDataResponseStruct::~SignatureDataResponseStruct(&local_288);
  AdaptEcdsaAdaptorRequestStruct::~AdaptEcdsaAdaptorRequestStruct(&local_108);
  AdaptEcdsaAdaptorRequest::~AdaptEcdsaAdaptorRequest(&local_98);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}